

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# throw_exception.hpp
# Opt level: O0

void __thiscall
boost::wrapexcept<boost::xpressive::regex_error>::copy_from
          (wrapexcept<boost::xpressive::regex_error> *this,exception *p)

{
  exception *in_RSI;
  exception *in_stack_ffffffffffffffe8;
  
  exception::operator=(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void copy_from( boost::exception const* p )
    {
        static_cast<boost::exception&>( *this ) = *p;
    }